

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  undefined1 *puVar1;
  int *piVar2;
  ushort uVar3;
  connectdata *conn;
  anon_union_8_12_57927972_for_p aVar4;
  long size;
  Curl_HttpReq httpreq_00;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  Curl_HttpReq httpreq;
  Curl_HttpReq local_ac;
  char *local_a8;
  char *local_a0;
  anon_union_8_12_57927972_for_p local_98;
  dynbuf req;
  char *request;
  char *te;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  conn = data->conn;
  te = "";
  *done = true;
  if (conn->transport != TRNSPRT_QUIC) {
    if (0x13 < conn->httpversion) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    if (conn->negnpn == 3) {
      conn->httpversion = '\x14';
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  aVar4 = (data->req).p;
  CVar5 = Curl_http_host(data,conn);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pcVar7 = Curl_checkheaders(data,"User-Agent");
  if (pcVar7 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  local_98 = aVar4;
  Curl_http_method(data,conn,&request,&httpreq);
  if ((data->state).up.query == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    bVar15 = false;
    pcVar7 = curl_maprintf("%s?%s",(data->state).up.path);
    if (pcVar7 == (char *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
      goto LAB_00122985;
    }
  }
  pcVar8 = pcVar7;
  if (pcVar7 == (char *)0x0) {
    pcVar8 = (data->state).up.path;
  }
  CVar5 = Curl_http_output_auth(data,conn,request,httpreq,pcVar8,false);
  (*Curl_cfree)(pcVar7);
  bVar15 = CVar5 == CURLE_OK;
LAB_00122985:
  if (!bVar15) {
    return CVar5;
  }
  (*Curl_cfree)((data->state).aptr.ref);
  (data->state).aptr.ref = (char *)0x0;
  if (((data->state).referer != (char *)0x0) &&
     (pcVar7 = Curl_checkheaders(data,"Referer"), pcVar7 == (char *)0x0)) {
    pcVar7 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
    (data->state).aptr.ref = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar7 = Curl_checkheaders(data,"Accept-Encoding");
  if ((pcVar7 == (char *)0x0) && ((data->set).str[9] != (char *)0x0)) {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    (data->state).aptr.accept_encoding = (char *)0x0;
    pcVar7 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[9]);
    (data->state).aptr.accept_encoding = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    (data->state).aptr.accept_encoding = (char *)0x0;
  }
  CVar5 = Curl_transferencode(data);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  CVar5 = Curl_http_body(data,conn,httpreq,&te);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pcVar7 = Curl_checkheaders(data,"Accept");
  CVar5 = Curl_http_resume(data,conn,httpreq);
  if (CVar5 == CURLE_OK) {
    CVar5 = Curl_http_range(data,httpreq);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    local_ac = httpreq;
    local_38 = "1.0";
    if ((((data->state).httpversion != '\n') && (conn->httpversion != '\n')) &&
       (local_38 = "1.1", (data->state).httpwant == '\x01')) {
      local_38 = "1.0";
    }
    Curl_dyn_init(&req,0x100000);
    Curl_dyn_reset(&(data->state).headerb);
    CVar5 = Curl_dyn_addf(&req,"%s ",request);
    if (CVar5 == CURLE_OK) {
      CVar5 = Curl_http_target(data,conn,&req);
    }
    if (CVar5 == CURLE_OK) {
      if ((((conn->bits).field_0x4 & 0x80) == 0) ||
         (pcVar8 = Curl_checkheaders(data,"Alt-Used"), pcVar8 != (char *)0x0)) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = curl_maprintf("Alt-Used: %s:%d\r\n",(conn->conn_to_host).name,
                                 (ulong)(uint)conn->conn_to_port);
        if (local_40 == (char *)0x0) {
          Curl_dyn_free(&req);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      pcVar8 = (data->state).aptr.host;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      pcVar11 = (data->state).aptr.proxyuserpwd;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "";
      }
      pcVar12 = (data->state).aptr.userpwd;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      pcVar14 = "";
      if (((data->state).field_0x661 & 4) != 0) {
        pcVar13 = (data->state).aptr.rangeline;
        pcVar14 = "";
        if (pcVar13 != (char *)0x0) {
          pcVar14 = pcVar13;
        }
      }
      pcVar13 = (data->set).str[0x26];
      local_48 = "";
      if ((pcVar13 != (char *)0x0) && (local_48 = "", *pcVar13 != '\0')) {
        pcVar13 = (data->state).aptr.uagent;
        local_48 = "";
        if (pcVar13 != (char *)0x0) {
          local_48 = pcVar13;
        }
      }
      local_50 = "Accept: */*\r\n";
      if (pcVar7 != (char *)0x0) {
        local_50 = "";
      }
      local_58 = (data->state).aptr.te;
      if (local_58 == (char *)0x0) {
        local_58 = "";
      }
      pcVar7 = (data->set).str[9];
      local_60 = "";
      if ((pcVar7 != (char *)0x0) && (local_60 = "", *pcVar7 != '\0')) {
        pcVar7 = (data->state).aptr.accept_encoding;
        local_60 = "";
        if (pcVar7 != (char *)0x0) {
          local_60 = pcVar7;
        }
      }
      pcVar7 = "";
      if ((data->state).referer != (char *)0x0) {
        pcVar13 = (data->state).aptr.ref;
        pcVar7 = "";
        if (pcVar13 != (char *)0x0) {
          pcVar7 = pcVar13;
        }
      }
      pcVar13 = "";
      if ((*(uint *)&(conn->bits).field_0x4 & 9) == 1) {
        local_a8 = pcVar14;
        local_a0 = pcVar11;
        pcVar9 = Curl_checkheaders(data,"Proxy-Connection");
        pcVar13 = "";
        pcVar11 = local_a0;
        pcVar14 = local_a8;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = Curl_checkProxyheaders(data,conn,"Proxy-Connection");
          pcVar13 = "";
          pcVar11 = local_a0;
          pcVar14 = local_a8;
          if (pcVar9 == (char *)0x0) {
            pcVar13 = "Proxy-Connection: Keep-Alive\r\n";
          }
        }
      }
      pcVar9 = local_40;
      pcVar10 = "";
      if (local_40 != (char *)0x0) {
        pcVar10 = local_40;
      }
      CVar5 = Curl_dyn_addf(&req," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",local_38,pcVar8,pcVar11,
                            pcVar12,pcVar14,local_48,local_50,local_58,local_60,pcVar7,pcVar13,te,
                            pcVar10);
      (*Curl_cfree)((data->state).aptr.userpwd);
      (data->state).aptr.userpwd = (char *)0x0;
      (*Curl_cfree)((data->state).aptr.proxyuserpwd);
      (data->state).aptr.proxyuserpwd = (char *)0x0;
      (*Curl_cfree)(pcVar9);
      if (CVar5 == CURLE_OK) {
        if ((((conn->handler->flags & 1) == 0) && (conn->httpversion != '\x14')) &&
           ((data->state).httpwant == '\x03')) {
          Curl_dyn_free(&req);
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        CVar5 = Curl_http_cookies(data,conn,&req);
        if (CVar5 == CURLE_OK) {
          CVar5 = Curl_add_timecondition(data,&req);
        }
        if (CVar5 == CURLE_OK) {
          CVar5 = Curl_add_custom_headers(data,false,&req);
        }
        httpreq_00 = local_ac;
        if (CVar5 == CURLE_OK) {
          (local_98.http)->postdata = (char *)0x0;
          if ((local_ac == HTTPREQ_HEAD) || (local_ac == HTTPREQ_GET)) {
            Curl_pgrsSetUploadSize(data,0);
          }
          CVar5 = Curl_http_bodysend(data,conn,&req,httpreq_00);
        }
        aVar4 = local_98;
        if (CVar5 == CURLE_OK) {
          if (((-1 < (local_98.http)->postsize) &&
              ((local_98.http)->postsize <= (data->req).writebytecount)) &&
             ((local_98.http)->sending != HTTPSEND_REQUEST)) {
            puVar1 = &(data->req).field_0xd8;
            *puVar1 = *puVar1 | 4;
          }
          size = (data->req).writebytecount;
          if (size == 0) {
            CVar5 = CURLE_OK;
          }
          else {
            Curl_pgrsSetUploadCounter(data,size);
            iVar6 = Curl_pgrsUpdate(data);
            CVar5 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar6 == 0) {
              CVar5 = CURLE_OK;
            }
            if ((aVar4.file)->freepath == (char *)0x0) {
              Curl_infof(data,"upload completely sent off: %ld out of %ld bytes",
                         (data->req).writebytecount,0);
              puVar1 = &(data->req).field_0xd8;
              *puVar1 = *puVar1 | 4;
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
              (data->req).exp100 = EXP100_SEND_DATA;
              Curl_expire_done(data,EXPIRE_100_TIMEOUT);
            }
          }
          if (conn->httpversion == '\x14') {
            uVar3 = *(ushort *)&(data->req).field_0xd8;
            if ((uVar3 & 0x40) != 0) {
              *(ushort *)&(data->req).field_0xd8 = uVar3 & 0xffbf;
              return CVar5;
            }
            return CVar5;
          }
          return CVar5;
        }
      }
    }
    Curl_dyn_free(&req);
    return CVar5;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  struct HTTP *http;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  if(conn->transport != TRNSPRT_QUIC) {
    if(conn->httpversion < 20) { /* unless the connection is re-used and
                                    already http2 */
      switch(conn->negnpn) {
      case CURL_HTTP_VERSION_2:
        conn->httpversion = 20; /* we know we're on HTTP/2 now */

        result = Curl_http2_switched(data, NULL, 0);
        if(result)
          return result;
        break;
      case CURL_HTTP_VERSION_1_1:
        /* continue with HTTP/1.1 when explicitly requested */
        break;
      default:
        /* Check if user wants to use HTTP/2 with clear TCP*/
#ifdef USE_NGHTTP2
        if(data->state.httpwant == CURL_HTTP_VERSION_2_PRIOR_KNOWLEDGE) {
#ifndef CURL_DISABLE_PROXY
          if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
            /* We don't support HTTP/2 proxies yet. Also it's debatable
               whether or not this setting should apply to HTTP/2 proxies. */
            infof(data, "Ignoring HTTP/2 prior knowledge due to proxy");
            break;
          }
#endif
          DEBUGF(infof(data, "HTTP/2 over clean TCP"));
          conn->httpversion = 20;

          result = Curl_http2_switched(data, NULL, 0);
          if(result)
            return result;
        }
#endif
        break;
      }
    }
    else {
      /* prepare for a http2 request */
      result = Curl_http2_setup(data, conn);
      if(result)
        return result;
    }
  }
  http = data->req.p.http;
  DEBUGASSERT(http);

  result = Curl_http_host(data, conn);
  if(result)
    return result;

  result = Curl_http_useragent(data);
  if(result)
    return result;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      return result;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, "Referer")) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, "Accept-Encoding") &&
     data->set.str[STRING_ENCODING]) {
    Curl_safefree(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = Curl_transferencode(data);
  if(result)
    return result;
#endif

  result = Curl_http_body(data, conn, httpreq, &te);
  if(result)
    return result;

  p_accept = Curl_checkheaders(data, "Accept")?NULL:"Accept: */*\r\n";

  result = Curl_http_resume(data, conn, httpreq);
  if(result)
    return result;

  result = Curl_http_range(data, httpreq);
  if(result)
    return result;

  httpstring = get_http_string(data, conn);

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = Curl_http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, "Alt-Used")) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host?data->state.aptr.host:""),
                  data->state.aptr.proxyuserpwd?
                  data->state.aptr.proxyuserpwd:"",
                  data->state.aptr.userpwd?data->state.aptr.userpwd:"",
                  (data->state.use_range && data->state.aptr.rangeline)?
                  data->state.aptr.rangeline:"",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent)?
                  data->state.aptr.uagent:"",
                  p_accept?p_accept:"",
                  data->state.aptr.te?data->state.aptr.te:"",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding)?
                  data->state.aptr.accept_encoding:"",
                  (data->state.referer && data->state.aptr.ref)?
                  data->state.aptr.ref:"" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, "Proxy-Connection") &&
                   !Curl_checkProxyheaders(data, conn, "Proxy-Connection"))?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid re-using old credentials
   * from re-used connections */
  Curl_safefree(data->state.aptr.userpwd);
  Curl_safefree(data->state.aptr.proxyuserpwd);
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if(!(conn->handler->flags&PROTOPT_SSL) &&
     conn->httpversion != 20 &&
     (data->state.httpwant == CURL_HTTP_VERSION_2)) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it isn't done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = Curl_http_cookies(data, conn, &req);
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, &req);

  if(!result) {
    http->postdata = NULL;  /* nothing to post at this point */
    if((httpreq == HTTPREQ_GET) ||
       (httpreq == HTTPREQ_HEAD))
      Curl_pgrsSetUploadSize(data, 0); /* nothing */

    /* bodysend takes ownership of the 'req' memory on success */
    result = Curl_http_bodysend(data, conn, &req, httpreq);
  }
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if((http->postsize > -1) &&
     (http->postsize <= data->req.writebytecount) &&
     (http->sending != HTTPSEND_REQUEST))
    data->req.upload_done = TRUE;

  if(data->req.writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is noted
       properly */
    Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;

    if(!http->postsize) {
      /* already sent the entire request body, mark the "upload" as
         complete */
      infof(data, "upload completely sent off: %" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes",
            data->req.writebytecount, http->postsize);
      data->req.upload_done = TRUE;
      data->req.keepon &= ~KEEP_SEND; /* we're done writing */
      data->req.exp100 = EXP100_SEND_DATA; /* already sent */
      Curl_expire_done(data, EXPIRE_100_TIMEOUT);
    }
  }

  if((conn->httpversion == 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
  return result;
}